

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cpp
# Opt level: O2

void __thiscall r_comp::Decompiler::write_icmd(Decompiler *this,uint16_t read_index)

{
  Metadata *this_00;
  short sVar1;
  short sVar2;
  ushort uVar3;
  uint16_t uVar4;
  uint16_t uVar5;
  bool bVar6;
  allocator local_51;
  bool after_tail_wildcard;
  
  if (this->closing_set == true) {
    this->closing_set = false;
    write_indent(this,this->indents);
  }
  after_tail_wildcard = true;
  OutStream::push<char>(this->out_stream,&after_tail_wildcard,read_index);
  write_expression_head(this,read_index);
  r_code::vector<r_code::Atom>::operator[]
            ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)(read_index + 1));
  sVar1 = r_code::Atom::asOpcode();
  this_00 = this->metadata;
  std::__cxx11::string::string((string *)&after_tail_wildcard,"_inj",&local_51);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          *)this_00,(key_type *)&after_tail_wildcard);
  sVar2 = r_code::Atom::asOpcode();
  std::__cxx11::string::~string((string *)&after_tail_wildcard);
  if (sVar1 == sVar2) {
    r_code::vector<r_code::Atom>::operator[]
              ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)(read_index + 2));
    uVar3 = r_code::Atom::asIndex();
    r_code::vector<r_code::Atom>::operator[]
              ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)uVar3 + 2);
    uVar4 = r_code::Atom::asIndex();
  }
  else {
    uVar4 = 0;
  }
  r_code::vector<r_code::Atom>::operator[]
            ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)read_index);
  uVar3 = r_code::Atom::getAtomCount();
  after_tail_wildcard = false;
  uVar3 = uVar3 & 0xff;
  while( true ) {
    read_index = read_index + 1;
    bVar6 = uVar3 == 0;
    uVar3 = uVar3 - 1;
    if (bVar6) break;
    if (after_tail_wildcard == false) {
      uVar5 = uVar4;
      if (this->closing_set == true) {
        this->closing_set = false;
        write_indent(this,this->indents);
      }
      else {
        local_51 = (allocator)0x20;
        OutStream::operator<<(this->out_stream,(char *)&local_51);
      }
    }
    else {
      uVar5 = 0;
    }
    write_any(this,read_index,&after_tail_wildcard,true,uVar5);
  }
  if (this->closing_set != false) {
    this->closing_set = false;
    write_indent(this,this->indents);
  }
  local_51 = (allocator)0x29;
  OutStream::operator<<(this->out_stream,(char *)&local_51);
  return;
}

Assistant:

void Decompiler::write_icmd(uint16_t read_index)
{
    if (closing_set) {
        closing_set = false;
        write_indent(indents);
    }

    out_stream->push('(', read_index);
    write_expression_head(read_index);
    //write_expression_tail(read_index,true);
    uint16_t write_as_view_index = 0;

    if (current_object->code[read_index + 1].asOpcode() == metadata->classes.find("_inj")->second.atom.asOpcode()) {
        uint16_t arg_set_index = current_object->code[read_index + 2].asIndex(); // 2 args for _inj; the view is the second.
        write_as_view_index = current_object->code[arg_set_index + 2].asIndex();
    }

    uint16_t arity = current_object->code[read_index].getAtomCount();
    bool after_tail_wildcard = false;

    for (uint16_t i = 0; i < arity; ++i) {
        if (after_tail_wildcard) {
            write_any(++read_index, after_tail_wildcard, true);
        } else {
            if (closing_set) {
                closing_set = false;
                write_indent(indents);
            } else {
                *out_stream << ' ';
            }

            write_any(++read_index, after_tail_wildcard, true, write_as_view_index);
        }
    }

    if (closing_set) {
        closing_set = false;
        write_indent(indents);
    }

    *out_stream << ')';
}